

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divceil.cpp
# Opt level: O1

test_call_type
__dispatch_divisor<unsigned_short>_std____cxx11__string_const___(string *divisor_type)

{
  int iVar1;
  const_iterator cVar2;
  logic_error *this;
  long lVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined1 local_1c3;
  undefined1 local_1c2;
  undefined1 local_1c1;
  undefined1 local_1c0 [32];
  _func_void_long_unsigned_long *local_1a0;
  _func_void_long_unsigned_long *local_198;
  _func_void_long_unsigned_long *local_190;
  _func_void_long_unsigned_long *local_188;
  _func_void_long_unsigned_long *local_180;
  _func_void_long_unsigned_long *local_178;
  _func_void_long_unsigned_long *local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
  local_168;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
  local_140;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
  local_118;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
  local_c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
  local_a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
  local_78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
  local_50;
  
  if (dispatch_divisor<unsigned_short>(std::__cxx11::string_const&)::test_calls_abi_cxx11_ == '\0')
  {
    iVar1 = __cxa_guard_acquire(&dispatch_divisor<unsigned_short>(std::__cxx11::string_const&)::
                                 test_calls_abi_cxx11_);
    if (iVar1 != 0) {
      local_1c0._0_8_ = test_all<unsigned_short,unsigned_char>;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
      ::pair<const_char_(&)[6],_void_(*)(long,_unsigned_long),_true>
                (&local_168,(char (*) [6])"uint8",(_func_void_long_unsigned_long **)local_1c0);
      local_170 = test_all<unsigned_short,unsigned_short>;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
      ::pair<const_char_(&)[7],_void_(*)(long,_unsigned_long),_true>
                (&local_140,(char (*) [7])"uint16",&local_170);
      local_178 = test_all<unsigned_short,unsigned_int>;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
      ::pair<const_char_(&)[7],_void_(*)(long,_unsigned_long),_true>
                (&local_118,(char (*) [7])"uint32",&local_178);
      local_180 = test_all<unsigned_short,unsigned_long>;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
      ::pair<const_char_(&)[7],_void_(*)(long,_unsigned_long),_true>
                (&local_f0,(char (*) [7])"uint64",&local_180);
      local_188 = test_all<unsigned_short,signed_char>;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
      ::pair<const_char_(&)[5],_void_(*)(long,_unsigned_long),_true>
                (&local_c8,(char (*) [5])0x11b021,&local_188);
      local_190 = test_all<unsigned_short,short>;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
      ::pair<const_char_(&)[6],_void_(*)(long,_unsigned_long),_true>
                (&local_a0,(char (*) [6])0x11b027,&local_190);
      local_198 = test_all<unsigned_short,int>;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
      ::pair<const_char_(&)[6],_void_(*)(long,_unsigned_long),_true>
                (&local_78,(char (*) [6])0x11b02e,&local_198);
      local_1a0 = test_all<unsigned_short,long>;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>
      ::pair<const_char_(&)[6],_void_(*)(long,_unsigned_long),_true>
                (&local_50,(char (*) [6])(anon_var_dwarf_1b2b3 + 0x73),&local_1a0);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(long,unsigned_long)>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(long,unsigned_long)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_Hashtable<std::pair<std::__cxx11::string_const,void(*)(long,unsigned_long)>const*>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(long,unsigned_long)>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(long,unsigned_long)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&dispatch_divisor<unsigned_short>(std::__cxx11::string_const&)::
                     test_calls_abi_cxx11_,&local_168,&stack0xffffffffffffffd8,0,&local_1c1,
                 &local_1c2,&local_1c3);
      lVar3 = -0x140;
      paVar4 = &local_50.first.field_2;
      do {
        if (paVar4 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar4->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar4->_M_allocated_capacity)[-2],
                          paVar4->_M_allocated_capacity + 1);
        }
        paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar4->_M_allocated_capacity + -5);
        lVar3 = lVar3 + 0x28;
      } while (lVar3 != 0);
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>_>_>
                   ::~unordered_map,
                   &dispatch_divisor<unsigned_short>(std::__cxx11::string_const&)::
                    test_calls_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&dispatch_divisor<unsigned_short>(std::__cxx11::string_const&)::
                           test_calls_abi_cxx11_);
    }
  }
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&dispatch_divisor<unsigned_short>(std::__cxx11::string_const&)::
                  test_calls_abi_cxx11_._M_h,divisor_type);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>,_true>
      ._M_cur != (__node_type *)0x0) {
    return *(test_call_type *)
            ((long)cVar2.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(long,_unsigned_long)>,_true>
                   ._M_cur + 0x28);
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  local_1c0._0_8_ = local_1c0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c0,anon_var_dwarf_1bcc7,anon_var_dwarf_1bcc7 + 0x3a);
  std::operator+(&local_168.first,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
                 divisor_type);
  std::logic_error::logic_error(this,(string *)&local_168);
  *(undefined ***)this = &PTR__logic_error_00126238;
  __cxa_throw(this,&boost::program_options::error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

test_call_type dispatch_divisor (const std::string & divisor_type)
{
    static const auto test_calls =
        std::unordered_map<std::string, test_call_type>
        {
            {"uint8", &test_all<Integer, std::uint8_t>},
            {"uint16", &test_all<Integer, std::uint16_t>},
            {"uint32", &test_all<Integer, std::uint32_t>},
            {"uint64", &test_all<Integer, std::uint64_t>},
            {"int8", &test_all<Integer, std::int8_t>},
            {"int16", &test_all<Integer, std::int16_t>},
            {"int32", &test_all<Integer, std::int32_t>},
            {"int64", &test_all<Integer, std::int64_t>}
        };

    auto call = test_calls.find(divisor_type);
    if (call != test_calls.end())
    {
        return call->second;
    }
    else
    {
        throw boost::program_options::error(u8"Неверная разрядность делителя: "_u8s + divisor_type);
    }
}